

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall
polyscope::SlicePlane::setSceneObjectUniforms(SlicePlane *this,ShaderProgram *p,bool alwaysPass)

{
  string *__rhs;
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 aVar14;
  col_type cVar15;
  mat4 viewMat;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __rhs = &this->postfix;
  std::operator+(&local_48,"u_slicePlaneNormal_",__rhs);
  iVar8 = (*p->_vptr_ShaderProgram[2])(p,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((char)iVar8 != '\0') {
    if (alwaysPass) {
      local_d8 = SUB648(ZEXT464(0xbf800000),0);
      local_f0 = 0.0;
      local_e8 = SUB648(ZEXT464(0x7f800000),0);
      local_ec = 0.0;
    }
    else {
      view::getCameraViewMatrix();
      bVar3 = (this->active).value;
      if (bVar3 == true) {
        uVar1 = (this->objectTransform).value.value[0].field_0;
        uVar2 = (this->objectTransform).value.value[0].field_1;
        fVar12 = (this->objectTransform).value.value[0].field_2.z;
        auVar11._0_4_ = (float)uVar1 * (float)uVar1;
        auVar11._4_4_ = (float)uVar2 * (float)uVar2;
        auVar11._8_8_ = 0;
        auVar10 = vhaddps_avx(auVar11,auVar11);
        auVar10 = ZEXT416((uint)(auVar10._0_4_ + fVar12 * fVar12));
        auVar10 = vsqrtss_avx(auVar10,auVar10);
        fVar9 = 1.0 / auVar10._0_4_;
        fVar12 = fVar12 * fVar9;
        auVar10._0_4_ = (float)uVar1 * fVar9;
        auVar10._4_4_ = (float)uVar2 * fVar9;
        auVar10._8_4_ = fVar9 * 0.0;
        auVar10._12_4_ = fVar9 * 0.0;
      }
      else {
        auVar10 = SUB6416(ZEXT464(0xbf800000),0);
        fVar12 = 0.0;
      }
      auVar11 = vmovshdup_avx(auVar10);
      fVar13 = auVar10._0_4_;
      fVar9 = (float)((ulong)local_b8 >> 0x20);
      fVar4 = (float)((ulong)local_c8 >> 0x20);
      fVar5 = (float)((ulong)local_a8 >> 0x20);
      fVar6 = (float)((ulong)local_98 >> 0x20);
      fVar7 = (uint)(bVar3 & 1) * (this->objectTransform).value.value[3].field_2;
      if (bVar3 == false) {
        cVar15 = SUB6416(ZEXT464(0x7f800000),0);
      }
      else {
        cVar15 = (this->objectTransform).value.value[3];
      }
      local_ec = fVar13 * local_c0 + auVar11._0_4_ * local_b0 + fVar12 * local_a0 + local_90 * 0.0;
      aVar14 = cVar15.field_0;
      auVar10 = vmovshdup_avx((undefined1  [16])cVar15);
      local_d8 = CONCAT44(fVar13 * fVar4 + auVar11._4_4_ * fVar9 + fVar12 * fVar5 + fVar6 * 0.0,
                          fVar13 * (float)local_c8 + auVar11._0_4_ * (float)local_b8 +
                          fVar12 * (float)local_a8 + (float)local_98 * 0.0);
      local_f0 = local_90 + fVar7 * local_a0 + aVar14.x * local_c0 + local_b0 * auVar10._0_4_;
      local_e8 = CONCAT44(fVar6 + fVar5 * fVar7 + fVar4 * aVar14.x + fVar9 * auVar10._4_4_,
                          (float)local_98 + (float)local_a8 * fVar7 +
                          (float)local_c8 * aVar14.x + (float)local_b8 * auVar10._0_4_);
    }
    std::operator+(&local_68,"u_slicePlaneNormal_",__rhs);
    (*p->_vptr_ShaderProgram[9])(local_d8,(ulong)(uint)local_ec,p,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    std::operator+(&local_88,"u_slicePlaneCenter_",__rhs);
    (*p->_vptr_ShaderProgram[9])(local_e8,(ulong)(uint)local_f0,p,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void SlicePlane::setSceneObjectUniforms(render::ShaderProgram& p, bool alwaysPass) {
  if (!p.hasUniform("u_slicePlaneNormal_" + postfix)) {
    return;
  }

  glm::vec3 normal, center;

  if (alwaysPass) {
    normal = glm::vec3{-1., 0., 0.};
    center = glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  } else {
    glm::mat4 viewMat = view::getCameraViewMatrix();
    normal = glm::vec3(viewMat * glm::vec4(getNormal(), 0.));
    center = glm::vec3(viewMat * glm::vec4(getCenter(), 1.));
  }

  p.setUniform("u_slicePlaneNormal_" + postfix, normal);
  p.setUniform("u_slicePlaneCenter_" + postfix, center);
}